

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool QPDF::pipeStreamData
               (shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
               QPDF *qpdf_for_warning,QPDFObjGen og,qpdf_offset_t offset,size_t length,
               QPDFObjectHandle *stream_dict,bool is_root_metadata,Pipeline *pipeline,
               bool suppress_warnings,bool will_retry)

{
  Pipeline *this;
  int __fd;
  element_type *peVar1;
  element_type *peVar2;
  size_t sVar3;
  QPDFExc *__return_storage_ptr__;
  qpdf_offset_t qVar4;
  size_t __n;
  exception *anon_var_0;
  QPDFExc *e;
  exception *e_1;
  string local_100;
  unsigned_long local_e0;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string buf;
  bool attempted_finish;
  shared_ptr<InputSource> local_78;
  shared_ptr<QPDF::EncryptionParameters> local_68;
  unique_ptr<Pipeline,_std::default_delete<Pipeline>_> local_58;
  unique_ptr<Pipeline,_std::default_delete<Pipeline>_> to_delete;
  bool will_retry_local;
  bool suppress_warnings_local;
  bool is_root_metadata_local;
  size_t length_local;
  qpdf_offset_t offset_local;
  QPDF *qpdf_for_warning_local;
  shared_ptr<InputSource> *file_local;
  shared_ptr<QPDF::EncryptionParameters> *encp_local;
  QPDFObjGen og_local;
  
  to_delete._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
  super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
  super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl._7_1_ = is_root_metadata;
  to_delete._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
  super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
  super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl._6_1_ = suppress_warnings;
  to_delete._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
  super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
  super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl._5_1_ = will_retry;
  std::unique_ptr<Pipeline,std::default_delete<Pipeline>>::
  unique_ptr<std::default_delete<Pipeline>,void>
            ((unique_ptr<Pipeline,std::default_delete<Pipeline>> *)&local_58);
  peVar1 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)encp);
  if ((peVar1->encrypted & 1U) != 0) {
    std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_68,encp);
    std::shared_ptr<InputSource>::shared_ptr(&local_78,file);
    decryptStream(&local_68,&local_78,qpdf_for_warning,&pipeline,og,stream_dict,
                  (bool)(to_delete._M_t.
                         super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
                         super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
                         super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl._7_1_ & 1),&local_58)
    ;
    std::shared_ptr<InputSource>::~shared_ptr(&local_78);
    std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_68);
  }
  buf.field_2._M_local_buf[0xb] = '\0';
  peVar2 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      file);
  __n = offset;
  InputSource::read_abi_cxx11_((InputSource *)local_b0,(int)peVar2,(void *)length,offset);
  sVar3 = std::__cxx11::string::size();
  this = pipeline;
  if (sVar3 != length) {
    e_1._6_1_ = 1;
    __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
    peVar2 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    local_e0 = std::__cxx11::string::size();
    qVar4 = toO<unsigned_long>(&local_e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"unexpected EOF reading stream data",
               (allocator<char> *)((long)&e_1 + 7));
    damagedPDF(__return_storage_ptr__,peVar2,&local_d0,offset + qVar4,&local_100);
    e_1._6_1_ = 0;
    __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  __fd = std::__cxx11::string::data();
  Pipeline::write(this,__fd,(void *)length,__n);
  buf.field_2._M_local_buf[0xb] = '\x01';
  (*pipeline->_vptr_Pipeline[3])();
  e_1._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_b0);
  std::unique_ptr<Pipeline,_std::default_delete<Pipeline>_>::~unique_ptr(&local_58);
  return true;
}

Assistant:

bool
QPDF::pipeStreamData(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    QPDFObjGen og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle stream_dict,
    bool is_root_metadata,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    std::unique_ptr<Pipeline> to_delete;
    if (encp->encrypted) {
        decryptStream(
            encp, file, qpdf_for_warning, pipeline, og, stream_dict, is_root_metadata, to_delete);
    }

    bool attempted_finish = false;
    try {
        auto buf = file->read(length, offset);
        if (buf.size() != length) {
            throw damagedPDF(
                *file, "", offset + toO(buf.size()), "unexpected EOF reading stream data");
        }
        pipeline->write(buf.data(), length);
        attempted_finish = true;
        pipeline->finish();
        return true;
    } catch (QPDFExc& e) {
        if (!suppress_warnings) {
            qpdf_for_warning.warn(e);
        }
    } catch (std::exception& e) {
        if (!suppress_warnings) {
            QTC::TC("qpdf", "QPDF decoding error warning");
            qpdf_for_warning.warn(
                // line-break
                damagedPDF(
                    *file,
                    "",
                    file->getLastOffset(),
                    ("error decoding stream data for object " + og.unparse(' ') + ": " +
                     e.what())));
            if (will_retry) {
                qpdf_for_warning.warn(
                    // line-break
                    damagedPDF(
                        *file,
                        "",
                        file->getLastOffset(),
                        "stream will be re-processed without filtering to avoid data loss"));
            }
        }
    }
    if (!attempted_finish) {
        try {
            pipeline->finish();
        } catch (std::exception&) {
            // ignore
        }
    }
    return false;
}